

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::NumberPragmaExpressionSyntax>
          (DeepCloneVisitor *this,NumberPragmaExpressionSyntax *node,BumpAllocator *alloc)

{
  NumberPragmaExpressionSyntax *pNVar1;
  Token local_50;
  Token local_40;
  Token local_30;
  
  local_30 = parsing::Token::deepClone(&node->size,alloc);
  local_40 = parsing::Token::deepClone(&node->base,alloc);
  local_50 = parsing::Token::deepClone(&node->value,alloc);
  pNVar1 = BumpAllocator::
           emplace<slang::syntax::NumberPragmaExpressionSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
                     (alloc,&local_30,&local_40,&local_50);
  return (SyntaxNode *)pNVar1;
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }